

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

JSONNode * __thiscall JSONNode::operator=(JSONNode *this,JSONNode *orig)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  allocator local_39;
  json_string local_38;
  
  piVar2 = this->internal;
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar2 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->internal != orig->internal) {
    decRef(this);
    piVar2 = orig->internal;
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 + 1;
    this->internal = piVar2;
  }
  return this;
}

Assistant:

inline JSONNode & JSONNode::operator = (const JSONNode & orig) json_nothrow {
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == orig.internal) return *this;  //don't want it accidentally deleting itself
    #endif
    decRef();  //dereference my current one
    internal = orig.internal -> incRef();  //increase reference of original
    return *this;
}